

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void CTPNCodeBody::enum_for_named_params(void *ctx,CTcSymbol *sym)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  CTcGenTarg *pCVar4;
  int argc;
  
  if (*(int *)&(sym->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 == 4) {
    if (sym[2].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.nxt_ !=
        (CVmHashEntry *)0x0) {
      defval_ctx::add((defval_ctx *)ctx,(CTcSymLocal *)sym);
      return;
    }
    pcVar3 = sym[2].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.str_;
    if (((ulong)pcVar3 & 0x200000000) == 0) {
      if (((ulong)pcVar3 & 0x400000000) != 0) {
        defval_ctx::gen_opt_positional((CTcSymLocal *)sym);
        return;
      }
    }
    else {
      argc = 1;
      if (((ulong)pcVar3 & 0x400000000) != 0) {
        CTcGenTarg::write_op(G_cg,'\b');
        pCVar4 = G_cg;
        iVar2 = G_cg->sp_depth_;
        iVar1 = iVar2 + 1;
        G_cg->sp_depth_ = iVar1;
        argc = 2;
        if (pCVar4->max_sp_depth_ <= iVar2) {
          pCVar4->max_sp_depth_ = iVar1;
        }
      }
      CTPNConst::s_gen_code_str_by_mode(sym);
      call_internal_bif("t3GetNamedArg",0x2d29,argc);
      (*(sym->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0x19])
                (sym,1,1,0,"=",0,0,0,0);
    }
  }
  return;
}

Assistant:

void CTPNCodeBody::enum_for_named_params(void *ctx, class CTcSymbol *sym)
{
    /* 
     *   If this is a local, and it's a named parameter, generate code to
     *   bind it.  If it's optional and has a default value expression, skip
     *   it on this pass, since we need to generate default expressions in
     *   the order in which they appear in the argument list to ensure that
     *   dependencies are resolved properly and side effects happen in the
     *   proper order.  
     */
    if (sym->get_type() == TC_SYM_LOCAL)
    {
        /* get the symbol, properly cast */
        CTcSymLocal *lcl = (CTcSymLocal *)sym;

        /* check what we have */
        if (lcl->get_defval_expr() != 0)
        {
            /*   
             *   It's an optional parameter (positional or named) with a
             *   default value.  We can't generate the binding yet, since we
             *   need to generate these in left-to-right order, and the table
             *   enumeration is in hash-table order instead.  So just add it
             *   to the context list, which we'll sort into the proper
             *   left-right sequence later.
             */
            ((defval_ctx *)ctx)->add(lcl);
        }
        else if (lcl->is_named_param())
        {
            /* 
             *   It's a named parameter - generate the binding code.  If it's
             *   optional, call t3GetNamedArg(name, nil) to use the default
             *   nil value if it's not defined.  If it's not optional, use
             *   t3GetNamedArg(name) to throw an error on failure.
             */
            int fargc = 1;
            if (lcl->is_opt_param())
            {
                /* optional parameter - call t3GetNamedArg(argname, nil) */
                G_cg->write_op(OPC_PUSHNIL);
                G_cg->note_push();
                ++fargc;
            }

            /* push the parameter name and call the appropriate builtin */
            CTPNConst::s_gen_code_str_by_mode(sym);
            call_internal_bif("t3GetNamedArg",
                              TCERR_NAMED_PARAM_MISSING_FUNC, fargc);

            /* 
             *   Assign the result to the local.  This is an implied
             *   assignment equivalent to binding an actual argument value to
             *   this formal. 
             */
            lcl->gen_code_asi(TRUE, 1, TC_ASI_SIMPLE, "=",
                              0, FALSE, FALSE, 0);
        }
        else if (lcl->is_opt_param())
        {
            /* 
             *   It's an optional parameter without a default value (we know
             *   there's no default, since we handled that case above).
             *   Generate code to load it if present.  
             */
            defval_ctx::gen_opt_positional(lcl);
        }
    }
}